

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

int IFN_Next_Line(FORM *form)

{
  FIELD *field_00;
  _Bool _Var1;
  int iVar2;
  FIELD *field;
  FORM *form_local;
  
  field_00 = form->current;
  iVar2 = form->currow + 1;
  form->currow = iVar2;
  if (iVar2 == field_00->drows) {
    if (((int)field_00->rows + field_00->nrow == 1) || (_Var1 = Field_Grown(field_00,1), !_Var1)) {
      form->currow = form->currow + -1;
      form_local._4_4_ = -0xc;
    }
    else {
      form_local._4_4_ = 0;
    }
  }
  else {
    form->curcol = 0;
    form_local._4_4_ = 0;
  }
  return form_local._4_4_;
}

Assistant:

static int IFN_Next_Line(FORM * form)
{
  FIELD *field = form->current;

  if ((++(form->currow))==field->drows)
    {
#if GROW_IF_NAVIGATE
      if (!Single_Line_Field(field) && Field_Grown(field,1))
        return(E_OK);
#endif
      form->currow--;
      return(E_REQUEST_DENIED);
    }
  form->curcol = 0;
  return(E_OK);
}